

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

bool __thiscall Map::Load(Map *this)

{
  _List_node_base **pp_Var1;
  short sVar2;
  World *pWVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar6;
  uchar index;
  int iVar7;
  uint uVar8;
  EffectType EVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  TileSpec TVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  WarpSpec WVar18;
  int iVar19;
  mapped_type *pmVar20;
  FILE *__stream;
  size_t sVar21;
  Map_Tile *pMVar22;
  ENF_Data *pEVar23;
  NPC *this_01;
  EIF_Data *pEVar24;
  long lVar25;
  bool bVar26;
  undefined8 uVar27;
  pointer psVar28;
  byte x;
  char buf [12];
  short local_108;
  uint local_104;
  int local_100;
  short local_e8;
  undefined1 local_d1;
  key_type local_d0;
  uint local_b0;
  uint local_ac;
  undefined8 local_a8;
  Map_Chest chest;
  string filename;
  char namebuf [6];
  
  if (this->id < 0) {
    return false;
  }
  pWVar3 = this->world;
  pp_Var1 = &chest.items.super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
  chest._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&chest,"MapDir","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)&chest);
  util::variant::GetString_abi_cxx11_(&filename,pmVar20);
  if ((_List_node_base **)chest._0_8_ != pp_Var1) {
    operator_delete((void *)chest._0_8_,
                    (ulong)((long)&(chest.items.
                                    super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  sprintf(namebuf,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::append((char *)&filename);
  std::__cxx11::string::append((char *)&filename);
  map_safe_fail_filename = filename._M_dataplus._M_p;
  __stream = fopen(filename._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    bVar26 = false;
    goto LAB_0016f73e;
  }
  this->has_timed_spikes = false;
  iVar7 = fseek(__stream,3,0);
  uVar27 = 0x1d1;
  if (iVar7 == 0) {
    sVar21 = fread(this->rid,1,4,__stream);
    uVar27 = 0x1d2;
    if (sVar21 == 4) {
      iVar7 = fseek(__stream,0x1f,0);
      if (iVar7 == 0) {
        sVar21 = fread(buf,1,2,__stream);
        if (sVar21 == 2) {
          uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
          this->pk = uVar8 == 3;
          EVar9 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
          this->effect = EVar9;
          iVar7 = fseek(__stream,0x25,0);
          if (iVar7 == 0) {
            sVar21 = fread(buf,1,2,__stream);
            if (sVar21 == 2) {
              uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
              this->width = (char)uVar8 + '\x01';
              uVar8 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
              bVar6 = (char)uVar8 + 1;
              this->height = bVar6;
              std::vector<Map_Tile,_std::allocator<Map_Tile>_>::resize
                        (&this->tiles,(ulong)this->width * (ulong)bVar6);
              iVar7 = fseek(__stream,0x2a,0);
              if (iVar7 == 0) {
                sVar21 = fread(buf,1,3,__stream);
                if (sVar21 == 3) {
                  uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                  this->scroll = uVar8 != 0;
                  uVar8 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                  this->relog_x = (uchar)uVar8;
                  uVar8 = PacketProcessor::Number(buf[2],0xfe,0xfe,0xfe);
                  this->relog_y = (uchar)uVar8;
                  iVar7 = fseek(__stream,0x2e,0);
                  if (iVar7 == 0) {
                    sVar21 = fread(buf,1,1,__stream);
                    if (sVar21 == 1) {
                      uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                      if (((char)uVar8 == '\0') ||
                         (iVar7 = fseek(__stream,(ulong)((uVar8 & 0xff) << 3),1), iVar7 == 0)) {
                        sVar21 = fread(buf,1,1,__stream);
                        if (sVar21 == 1) {
                          uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                          if (((char)uVar8 == '\0') ||
                             (iVar7 = fseek(__stream,(ulong)((uVar8 & 0xff) << 2),1), iVar7 == 0)) {
                            sVar21 = fread(buf,1,1,__stream);
                            if (sVar21 == 1) {
                              uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                              if (((uVar8 & 0xff) == 0) ||
                                 (iVar7 = fseek(__stream,(ulong)((uVar8 & 0xff) * 0xc),1),
                                 iVar7 == 0)) {
                                sVar21 = fread(buf,1,1,__stream);
                                if (sVar21 == 1) {
                                  uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                  if ((uVar8 & 0xff) != 0) {
                                    uVar14 = 0;
                                    do {
                                      sVar21 = fread(buf,1,2,__stream);
                                      if (sVar21 != 2) {
                                        fclose(__stream);
                                        bVar26 = false;
                                        Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                     map_safe_fail_filename,0x204);
                                        goto LAB_0016f73e;
                                      }
                                      uVar10 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                      uVar11 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                      uVar11 = uVar11 & 0xff;
                                      if (uVar11 != 0) {
                                        bVar6 = (byte)uVar10;
                                        do {
                                          sVar21 = fread(buf,1,2,__stream);
                                          if (sVar21 != 2) {
                                            fclose(__stream);
                                            bVar26 = false;
                                            Console::Err("Invalid file / failed read/seek: %s -- %i"
                                                         ,map_safe_fail_filename,0x209);
                                            goto LAB_0016f73e;
                                          }
                                          uVar12 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          TVar13 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                          x = (byte)uVar12;
                                          if ((x < this->width) && (bVar6 < this->height)) {
                                            pMVar22 = GetTile(this,x,bVar6);
                                            pMVar22->tilespec = TVar13 & 0xff;
                                            if ((char)TVar13 == '\"') {
                                              this->has_timed_spikes = true;
                                            }
                                            else if ((TVar13 & 0xff) == Chest) {
                                              chest.items.
                                              super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                              ._M_impl._M_node.super__List_node_base._M_next =
                                                   (_List_node_base *)&chest.items;
                                              chest.items.
                                              super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                              ._M_impl._M_node._M_size = 0;
                                              chest.spawns.
                                              super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                              ._M_impl._M_node.super__List_node_base._M_next =
                                                   (_List_node_base *)&chest.spawns;
                                              chest.spawns.
                                              super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                              ._M_impl._M_node._M_size = 0;
                                              pWVar3 = this->world;
                                              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2
                                              ;
                                              chest.items.
                                              super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                              ._M_impl._M_node.super__List_node_base._M_prev =
                                                   chest.items.
                                                                                                      
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next;
                                              chest.spawns.
                                              super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                              ._M_impl._M_node.super__List_node_base._M_prev =
                                                   chest.spawns.
                                                                                                      
                                                  super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_d0,"MaxChest","");
                                              pmVar20 = std::__detail::
                                                                                                                
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar3->config,&local_d0);
                                              chest.maxchest = util::variant::GetInt(pmVar20);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_d0._M_dataplus._M_p != &local_d0.field_2)
                                              {
                                                operator_delete(local_d0._M_dataplus._M_p,
                                                                local_d0.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              pWVar3 = this->world;
                                              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2
                                              ;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_d0,"ChestSlots","");
                                              pmVar20 = std::__detail::
                                                                                                                
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar3->config,&local_d0);
                                              chest.chestslots = util::variant::GetInt(pmVar20);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_d0._M_dataplus._M_p != &local_d0.field_2)
                                              {
                                                operator_delete(local_d0._M_dataplus._M_p,
                                                                local_d0.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              chest.y = bVar6;
                                              chest.x = x;
                                              chest.slots = 0;
                                              local_d0._M_dataplus._M_p = (pointer)0x0;
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              __shared_count<Map_Chest,std::allocator<Map_Chest>,Map_Chest&>
                                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                          *)&local_d0._M_string_length,
                                                         (Map_Chest **)&local_d0,
                                                         (allocator<Map_Chest> *)&local_d1,&chest);
                                              std::
                                              vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                              ::emplace_back<std::shared_ptr<Map_Chest>>
                                                        ((
                                                  vector<std::shared_ptr<Map_Chest>,std::allocator<std::shared_ptr<Map_Chest>>>
                                                  *)&this->chests,(shared_ptr<Map_Chest> *)&local_d0
                                                  );
                                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_d0._M_string_length !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  local_d0._M_string_length);
                                              }
                                              Map_Chest::~Map_Chest(&chest);
                                            }
                                          }
                                          else {
                                            Console::Wrn(
                                                  "Tile spec on map %i is outside of map bounds (%ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)(uVar12 & 0xff)
                                                  ,(ulong)uVar10 & 0xff);
                                          }
                                          uVar11 = uVar11 - 1;
                                        } while (uVar11 != 0);
                                      }
                                      uVar14 = uVar14 + 1;
                                    } while (uVar14 != (uVar8 & 0xff));
                                  }
                                  sVar21 = fread(buf,1,1,__stream);
                                  if (sVar21 == 1) {
                                    uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                    if ((uVar8 & 0xff) != 0) {
                                      local_104 = 0;
                                      do {
                                        sVar21 = fread(buf,1,2,__stream);
                                        if (sVar21 != 2) {
                                          fclose(__stream);
                                          bVar26 = false;
                                          Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                       map_safe_fail_filename,0x22b);
                                          goto LAB_0016f73e;
                                        }
                                        uVar10 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                        uVar14 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                        for (uVar14 = uVar14 & 0xff; uVar14 != 0;
                                            uVar14 = uVar14 - 1) {
                                          sVar21 = fread(buf,1,8,__stream);
                                          if (sVar21 != 8) {
                                            fclose(__stream);
                                            bVar26 = false;
                                            Console::Err("Invalid file / failed read/seek: %s -- %i"
                                                         ,map_safe_fail_filename,0x231);
                                            goto LAB_0016f73e;
                                          }
                                          uVar11 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          uVar12 = PacketProcessor::Number(buf[1],buf[2],0xfe,0xfe);
                                          uVar15 = PacketProcessor::Number(buf[3],0xfe,0xfe,0xfe);
                                          uVar16 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                          uVar17 = PacketProcessor::Number(buf[5],0xfe,0xfe,0xfe);
                                          WVar18 = PacketProcessor::Number(buf[6],buf[7],0xfe,0xfe);
                                          if (((byte)uVar11 < this->width) &&
                                             ((byte)uVar10 < this->height)) {
                                            pMVar22 = GetTile(this,(byte)uVar11,(byte)uVar10);
                                            (pMVar22->warp).map = (short)uVar12;
                                            (pMVar22->warp).x = (uchar)uVar15;
                                            (pMVar22->warp).y = (uchar)uVar16;
                                            (pMVar22->warp).levelreq = (uchar)uVar17;
                                            (pMVar22->warp).spec = WVar18;
                                            (pMVar22->warp).open = false;
                                          }
                                          else {
                                            Console::Wrn(
                                                  "Warp on map %i is outside of map bounds (%ix%i)",
                                                  (ulong)(uint)(int)this->id,(ulong)(uVar11 & 0xff),
                                                  (ulong)uVar10 & 0xff);
                                          }
                                        }
                                        local_104 = local_104 + 1;
                                      } while (local_104 != (uVar8 & 0xff));
                                    }
                                    iVar7 = fseek(__stream,0x2e,0);
                                    if (iVar7 == 0) {
                                      sVar21 = fread(buf,1,1,__stream);
                                      if (sVar21 == 1) {
                                        local_b0 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                        local_b0 = local_b0 & 0xff;
                                        if (local_b0 != 0) {
                                          local_a8 = &this->npcs;
                                          index = '\0';
                                          local_ac = 0;
                                          do {
                                            sVar21 = fread(buf,1,8,__stream);
                                            if (sVar21 != 8) {
                                              fclose(__stream);
                                              bVar26 = false;
                                              Console::Err(
                                                  "Invalid file / failed read/seek: %s -- %i",
                                                  map_safe_fail_filename,0x252);
                                              goto LAB_0016f73e;
                                            }
                                            uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                            uVar14 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
                                            uVar10 = PacketProcessor::Number
                                                               (buf[2],buf[3],0xfe,0xfe);
                                            uVar11 = PacketProcessor::Number(buf[4],0xfe,0xfe,0xfe);
                                            uVar12 = PacketProcessor::Number
                                                               (buf[5],buf[6],0xfe,0xfe);
                                            uVar15 = PacketProcessor::Number(buf[7],0xfe,0xfe,0xfe);
                                            local_108 = (short)uVar10;
                                            uVar10 = (uint)local_108;
                                            pEVar23 = ENF::Get(this->world->enf,uVar10);
                                            if (pEVar23->id == 0) {
                                              Console::Wrn(
                                                  "An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,uVar10,
                                                  (ulong)(uVar8 & 0xff),(ulong)(uVar14 & 0xff));
                                            }
                                            uVar15 = uVar15 & 0xff;
                                            if (uVar15 != 0) {
                                              do {
                                                if (((byte)uVar8 < this->width) &&
                                                   ((byte)uVar14 < this->height)) {
                                                  this_01 = (NPC *)operator_new(0x70);
                                                  NPC::NPC(this_01,this,local_108,(byte)uVar8,
                                                           (byte)uVar14,(uchar)uVar11,(short)uVar12,
                                                           index,false);
                                                  chest._0_8_ = this_01;
                                                  std::vector<NPC_*,_std::allocator<NPC_*>_>::
                                                  push_back(local_a8,(value_type *)&chest);
                                                  NPC::Spawn((NPC *)chest._0_8_,(NPC *)0x0);
                                                  index = index + '\x01';
                                                }
                                                else {
                                                  sVar2 = this->id;
                                                  pEVar23 = ENF::Get(this->world->enf,uVar10);
                                                  Console::Wrn(
                                                  "An NPC spawn on map %i is outside of map bounds (%s at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar2,
                                                  (pEVar23->name)._M_dataplus._M_p,
                                                  (ulong)uVar8 & 0xff,(ulong)(uVar14 & 0xff));
                                                }
                                                uVar15 = uVar15 - 1;
                                              } while (uVar15 != 0);
                                            }
                                            local_ac = local_ac + 1;
                                          } while (local_ac != local_b0);
                                        }
                                        sVar21 = fread(buf,1,1,__stream);
                                        uVar27 = 0x26e;
                                        if (sVar21 == 1) {
                                          uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                          if ((char)uVar8 != '\0') {
                                            iVar7 = fseek(__stream,(ulong)((uVar8 & 0xff) << 2),1);
                                            uVar27 = 0x272;
                                            if (iVar7 != 0) goto LAB_0016f5a7;
                                          }
                                          sVar21 = fread(buf,1,1,__stream);
                                          uVar27 = 0x275;
                                          if (sVar21 == 1) {
                                            uVar8 = PacketProcessor::Number(buf[0],0xfe,0xfe,0xfe);
                                            local_a8 = (vector<NPC_*,_std::allocator<NPC_*>_> *)
                                                       (CONCAT44(local_a8._4_4_,uVar8) &
                                                       0xffffffff000000ff);
                                            if ((uVar8 & 0xff) != 0) {
                                              local_100 = 0;
                                              do {
                                                sVar21 = fread(buf,1,0xc,__stream);
                                                if (sVar21 != 0xc) {
                                                  fclose(__stream);
                                                  bVar26 = false;
                                                  Console::Err(
                                                  "Invalid file / failed read/seek: %s -- %i",
                                                  map_safe_fail_filename,0x279);
                                                  goto LAB_0016f73e;
                                                }
                                                uVar8 = PacketProcessor::Number
                                                                  (buf[0],0xfe,0xfe,0xfe);
                                                uVar14 = PacketProcessor::Number
                                                                   (buf[1],0xfe,0xfe,0xfe);
                                                uVar10 = PacketProcessor::Number
                                                                   (buf[4],0xfe,0xfe,0xfe);
                                                uVar11 = PacketProcessor::Number
                                                                   (buf[5],buf[6],0xfe,0xfe);
                                                uVar12 = PacketProcessor::Number
                                                                   (buf[7],buf[8],0xfe,0xfe);
                                                uVar15 = PacketProcessor::Number
                                                                   (buf[9],buf[10],buf[0xb],0xfe);
                                                local_e8 = (short)uVar11;
                                                uVar11 = (uint)local_e8;
                                                pEVar24 = EIF::Get(this->world->eif,uVar11);
                                                if (uVar11 != pEVar24->id) {
                                                  Console::Wrn(
                                                  "A chest spawn on map %i uses a non-existent item (#%i at %ix%i)"
                                                  ,(ulong)(uint)(int)this->id,(ulong)uVar11,
                                                  (ulong)(uVar8 & 0xff),(ulong)(uVar14 & 0xff));
                                                }
                                                psVar28 = (this->chests).
                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                psVar4 = (this->chests).
                                                                                                                  
                                                  super__Vector_base<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                if (psVar28 != psVar4) {
                                                  iVar7 = (short)uVar10 + 1;
                                                  do {
                                                    peVar5 = (psVar28->
                                                                                                                          
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr;
                                                  this_00 = (psVar28->
                                                                                                                        
                                                  super___shared_ptr<Map_Chest,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_refcount._M_pi;
                                                  if (this_00 !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      this_00->_M_use_count =
                                                           this_00->_M_use_count + 1;
                                                      UNLOCK();
                                                    }
                                                    else {
                                                      this_00->_M_use_count =
                                                           this_00->_M_use_count + 1;
                                                    }
                                                  }
                                                  bVar26 = true;
                                                  if ((peVar5->x == (uchar)uVar8) &&
                                                     (peVar5->y == (uchar)uVar14)) {
                                                    chest.items.
                                                                                                        
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_6_ = CONCAT24((short)uVar12,iVar7);
                                                  chest.items.
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node._M_size =
                                                       (size_t)Timer::GetTime();
                                                  chest._4_2_ = local_e8;
                                                  chest.items.
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next =
                                                       (_List_node_base *)
                                                       CONCAT44(chest.items.
                                                                                                                                
                                                  super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next.
                                                  _4_4_,uVar15);
                                                  std::__cxx11::
                                                  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>
                                                  ::push_back(&peVar5->spawns,(value_type *)&chest);
                                                  iVar19 = peVar5->slots;
                                                  if (peVar5->slots <= iVar7) {
                                                    iVar19 = iVar7;
                                                  }
                                                  peVar5->slots = iVar19;
                                                  bVar26 = false;
                                                  }
                                                  if (this_00 !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(this_00);
                                                  }
                                                  if (!bVar26) goto LAB_0016f577;
                                                  psVar28 = psVar28 + 1;
                                                  } while (psVar28 != psVar4);
                                                }
                                                sVar2 = this->id;
                                                pEVar24 = EIF::Get(this->world->eif,uVar11);
                                                Console::Wrn(
                                                  "A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)"
                                                  ,(ulong)(uint)(int)sVar2,
                                                  (pEVar24->name)._M_dataplus._M_p,(ulong)uVar15,
                                                  (ulong)(uVar8 & 0xff),(ulong)(uVar14 & 0xff));
LAB_0016f577:
                                                local_100 = local_100 + 1;
                                              } while (local_100 != (int)local_a8);
                                            }
                                            iVar7 = fseek(__stream,0,2);
                                            uVar27 = 0x29c;
                                            if (iVar7 == 0) {
                                              lVar25 = ftell(__stream);
                                              this->filesize = (int)lVar25;
                                              fclose(__stream);
                                              this->exists = true;
                                              bVar26 = true;
                                              goto LAB_0016f73e;
                                            }
                                          }
                                        }
LAB_0016f5a7:
                                        fclose(__stream);
                                        bVar26 = false;
                                        Console::Err("Invalid file / failed read/seek: %s -- %i",
                                                     map_safe_fail_filename,uVar27);
                                        goto LAB_0016f73e;
                                      }
                                      fclose(__stream);
                                      uVar27 = 0x24d;
                                    }
                                    else {
                                      fclose(__stream);
                                      uVar27 = 0x24c;
                                    }
                                  }
                                  else {
                                    fclose(__stream);
                                    uVar27 = 0x227;
                                  }
                                }
                                else {
                                  fclose(__stream);
                                  uVar27 = 0x200;
                                }
                              }
                              else {
                                fclose(__stream);
                                uVar27 = 0x1fd;
                              }
                            }
                            else {
                              fclose(__stream);
                              uVar27 = 0x1f9;
                            }
                          }
                          else {
                            fclose(__stream);
                            uVar27 = 0x1f6;
                          }
                        }
                        else {
                          fclose(__stream);
                          uVar27 = 0x1f2;
                        }
                      }
                      else {
                        fclose(__stream);
                        uVar27 = 0x1ef;
                      }
                    }
                    else {
                      fclose(__stream);
                      uVar27 = 0x1eb;
                    }
                  }
                  else {
                    fclose(__stream);
                    uVar27 = 0x1ea;
                  }
                }
                else {
                  fclose(__stream);
                  uVar27 = 0x1e5;
                }
              }
              else {
                fclose(__stream);
                uVar27 = 0x1e4;
              }
            }
            else {
              fclose(__stream);
              uVar27 = 0x1de;
            }
          }
          else {
            fclose(__stream);
            uVar27 = 0x1dd;
          }
        }
        else {
          fclose(__stream);
          uVar27 = 0x1d9;
        }
      }
      else {
        fclose(__stream);
        uVar27 = 0x1d8;
      }
      bVar26 = false;
      Console::Err("Invalid file / failed read/seek: %s -- %i",map_safe_fail_filename,uVar27);
      goto LAB_0016f73e;
    }
  }
  fclose(__stream);
  bVar26 = false;
  Console::Err("Invalid file / failed read/seek: %s -- %i",map_safe_fail_filename,uVar27);
LAB_0016f73e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return bVar26;
}

Assistant:

bool Map::Load()
{
	char namebuf[6];

	if (this->id < 0)
	{
		return false;
	}

	std::string filename = this->world->config["MapDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename.append(namebuf);
	filename.append(".emf");

	map_safe_fail_filename = filename.c_str();

	std::FILE *fh = std::fopen(filename.c_str(), "rb");

	if (!fh)
		return false;

	this->has_timed_spikes = false;

	SAFE_SEEK(fh, 0x03, SEEK_SET);
	SAFE_READ(this->rid, sizeof(char), 4, fh);

	char buf[12];
	unsigned char outersize;
	unsigned char innersize;

	SAFE_SEEK(fh, 0x1F, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->pk = PacketProcessor::Number(buf[0]) == 3;
	this->effect = static_cast<EffectType>(PacketProcessor::Number(buf[1]));

	SAFE_SEEK(fh, 0x25, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 2, fh);
	this->width = PacketProcessor::Number(buf[0]) + 1;
	this->height = PacketProcessor::Number(buf[1]) + 1;

	this->tiles.resize(this->height * this->width);

	SAFE_SEEK(fh, 0x2A, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 3, fh);
	this->scroll = PacketProcessor::Number(buf[0]);
	this->relog_x = PacketProcessor::Number(buf[1]);
	this->relog_y = PacketProcessor::Number(buf[2]);

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 8 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 12 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			SAFE_READ(buf, sizeof(char), 2, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			unsigned char spec = PacketProcessor::Number(buf[1]);

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Tile spec on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			this->GetTile(xloc, yloc).tilespec = static_cast<Map_Tile::TileSpec>(spec);

			if (spec == Map_Tile::Chest)
			{
				Map_Chest chest;
				chest.maxchest = static_cast<int>(this->world->config["MaxChest"]);
				chest.chestslots = static_cast<int>(this->world->config["ChestSlots"]);
				chest.x = xloc;
				chest.y = yloc;
				chest.slots = 0;
				this->chests.push_back(std::make_shared<Map_Chest>(chest));
			}

			if (spec == Map_Tile::Spikes1)
			{
				this->has_timed_spikes = true;
			}
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 2, fh);
		unsigned char yloc = PacketProcessor::Number(buf[0]);
		innersize = PacketProcessor::Number(buf[1]);
		for (int ii = 0; ii < innersize; ++ii)
		{
			Map_Warp newwarp;
			SAFE_READ(buf, sizeof(char), 8, fh);
			unsigned char xloc = PacketProcessor::Number(buf[0]);
			newwarp.map = PacketProcessor::Number(buf[1], buf[2]);
			newwarp.x = PacketProcessor::Number(buf[3]);
			newwarp.y = PacketProcessor::Number(buf[4]);
			newwarp.levelreq = PacketProcessor::Number(buf[5]);
			newwarp.spec = static_cast<Map_Warp::WarpSpec>(PacketProcessor::Number(buf[6], buf[7]));

			if (!this->InBounds(xloc, yloc))
			{
				Console::Wrn("Warp on map %i is outside of map bounds (%ix%i)", this->id, xloc, yloc);
				continue;
			}

			try
			{
				this->GetTile(xloc, yloc).warp = newwarp;
			}
			catch (...)
			{
				std::fclose(fh);
				map_safe_fail(__LINE__);
				return false;
			}
		}
	}

	SAFE_SEEK(fh, 0x2E, SEEK_SET);
	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	int index = 0;
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 8, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short npc_id = PacketProcessor::Number(buf[2], buf[3]);
		unsigned char spawntype = PacketProcessor::Number(buf[4]);
		short spawntime = PacketProcessor::Number(buf[5], buf[6]);
		unsigned char amount = PacketProcessor::Number(buf[7]);

		if (!this->world->enf->Get(npc_id))
		{
			Console::Wrn("An NPC spawn on map %i uses a non-existent NPC (#%i at %ix%i)", this->id, npc_id, x, y);
		}

		for (int ii = 0; ii < amount; ++ii)
		{
			if (!this->InBounds(x, y))
			{
				Console::Wrn("An NPC spawn on map %i is outside of map bounds (%s at %ix%i)", this->id, this->world->enf->Get(npc_id).name.c_str(), x, y);
				continue;
			}

			NPC *newnpc = new NPC(this, npc_id, x, y, spawntype, spawntime, index++);
			this->npcs.push_back(newnpc);

			newnpc->Spawn();
		}
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	if (outersize)
	{
		SAFE_SEEK(fh, 4 * outersize, SEEK_CUR);
	}

	SAFE_READ(buf, sizeof(char), 1, fh);
	outersize = PacketProcessor::Number(buf[0]);
	for (int i = 0; i < outersize; ++i)
	{
		SAFE_READ(buf, sizeof(char), 12, fh);
		unsigned char x = PacketProcessor::Number(buf[0]);
		unsigned char y = PacketProcessor::Number(buf[1]);
		short slot = PacketProcessor::Number(buf[4]);
		short itemid = PacketProcessor::Number(buf[5], buf[6]);
		short time = PacketProcessor::Number(buf[7], buf[8]);
		int amount = PacketProcessor::Number(buf[9], buf[10], buf[11]);

		if (itemid != this->world->eif->Get(itemid).id)
		{
			Console::Wrn("A chest spawn on map %i uses a non-existent item (#%i at %ix%i)", this->id, itemid, x, y);
		}

		UTIL_FOREACH(this->chests, chest)
		{
			if (chest->x == x && chest->y == y)
			{
				Map_Chest_Spawn spawn;

				spawn.slot = slot+1;
				spawn.time = time;
				spawn.last_taken = Timer::GetTime();
				spawn.item.id = itemid;
				spawn.item.amount = amount;

				chest->spawns.push_back(spawn);
				chest->slots = std::max(chest->slots, slot+1);
				goto skip_warning;
			}
		}
		Console::Wrn("A chest spawn on map %i points to a non-chest (%s x%i at %ix%i)", this->id, this->world->eif->Get(itemid).name.c_str(), amount, x, y);
		skip_warning:
		;
	}

	SAFE_SEEK(fh, 0x00, SEEK_END);
	this->filesize = std::ftell(fh);

	std::fclose(fh);

	this->exists = true;

	return true;
}